

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O3

bool Diligent::ShaderSerializer<(Diligent::SerializerMode)2>::SerializeBytecodeOrSource
               (Serializer<(Diligent::SerializerMode)2> *Ser,ConstQual<ShaderCreateInfo> *CI)

{
  bool bVar1;
  void *pvVar2;
  Char *pData;
  Uint8 UseBytecode;
  string msg;
  uchar local_39;
  string local_38;
  
  pvVar2 = CI->ByteCode;
  if (pvVar2 != (void *)0x0 && CI->Source != (Char *)0x0) {
    FormatString<char[47]>
              (&local_38,(char (*) [47])"Only one of Source or Bytecode can be non-null");
    DebugAssertionFailed
              ((Char *)CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_),
               "SerializeBytecodeOrSource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PSOSerializer.cpp"
               ,0x1ca);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    pvVar2 = CI->ByteCode;
  }
  local_39 = pvVar2 != (void *)0x0;
  bVar1 = Serializer<(Diligent::SerializerMode)2>::Copy<unsigned_char_const>(Ser,&local_39,1);
  if (bVar1) {
    if (local_39 == '\0') {
      pData = CI->Source;
    }
    else {
      pData = (Char *)CI->ByteCode;
    }
    local_38._M_dataplus._M_p._0_4_ = *(undefined4 *)&CI->field_4;
    bVar1 = Serializer<(Diligent::SerializerMode)2>::Copy<unsigned_int_const>
                      (Ser,(uint *)&local_38,4);
    if (bVar1) {
      Serializer<(Diligent::SerializerMode)2>::AlignOffset(Ser,8);
      bVar1 = Serializer<(Diligent::SerializerMode)2>::Copy<void_const>
                        (Ser,pData,(CI->field_4).SourceLength);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ShaderSerializer<Mode>::SerializeBytecodeOrSource(Serializer<Mode>&            Ser,
                                                       ConstQual<ShaderCreateInfo>& CI)
{
    VERIFY(CI.Source == nullptr || CI.ByteCode == nullptr, "Only one of Source or Bytecode can be non-null");
    const Uint8 UseBytecode = CI.ByteCode != nullptr ? 1 : 0;

    if (!Ser(UseBytecode))
        return false;

    if (UseBytecode)
        return Ser.SerializeBytes(CI.ByteCode, CI.ByteCodeSize);
    else
        return Ser.SerializeBytes(CI.Source, CI.SourceLength);
}